

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O0

void __thiscall
irr::scene::CSkinnedMesh::getFrameData
          (CSkinnedMesh *this,f32 frame,SJoint *joint,vector3df *position,s32 *positionHint,
          vector3df *scale,s32 *scaleHint,quaternion *rotation,s32 *rotationHint)

{
  uint uVar1;
  quaternion q2;
  quaternion q1;
  u32 uVar2;
  SPositionKey *pSVar3;
  SScaleKey *pSVar4;
  SRotationKey *pSVar5;
  uint *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  uint *in_R9;
  float in_XMM0_Da;
  vector3d<float> vVar6;
  undefined8 *in_stack_00000008;
  uint *in_stack_00000010;
  f32 t;
  f32 fd2_2;
  f32 fd1_2;
  SRotationKey *KeyB_2;
  SRotationKey *KeyA_2;
  u32 i_2;
  f32 fd2_1;
  f32 fd1_1;
  SScaleKey *KeyB_1;
  SScaleKey *KeyA_1;
  u32 i_1;
  f32 fd2;
  f32 fd1;
  SPositionKey *KeyB;
  SPositionKey *KeyA;
  u32 i;
  array<irr::scene::ISkinnedMesh::SRotationKey> *RotationKeys;
  array<irr::scene::ISkinnedMesh::SScaleKey> *ScaleKeys;
  array<irr::scene::ISkinnedMesh::SPositionKey> *PositionKeys;
  s32 foundRotationIndex;
  s32 foundScaleIndex;
  s32 foundPositionIndex;
  uint in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  uint in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  uint in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  uint local_194;
  undefined8 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined8 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe88;
  f32 in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe98;
  f32 in_stack_fffffffffffffe9c;
  uint local_fc;
  uint local_64;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  if (*(long *)(in_RSI + 0x250) != 0) {
    uVar2 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::size
                      ((array<irr::scene::ISkinnedMesh::SPositionKey> *)0x29fa28);
    if (uVar2 != 0) {
      local_3c = 0xffffffff;
      if ((-1 < (int)*in_RCX) &&
         (uVar1 = *in_RCX,
         uVar2 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::size
                           ((array<irr::scene::ISkinnedMesh::SPositionKey> *)0x29fa68),
         uVar1 < uVar2)) {
        if (((int)*in_RCX < 1) ||
           ((pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                                ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                 in_stack_fffffffffffffdfc), (float)pSVar3->frame < in_XMM0_Da ||
            (pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                                ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                 in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar3->frame))))
        {
          uVar1 = *in_RCX;
          uVar2 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::size
                            ((array<irr::scene::ISkinnedMesh::SPositionKey> *)0x29fb08);
          if (((int)(uVar1 + 1) < (int)uVar2) &&
             ((pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                                  ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar3->frame &&
              (pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                                  ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc), (float)pSVar3->frame < in_XMM0_Da))))
          {
            *in_RCX = *in_RCX + 1;
            local_3c = *in_RCX;
          }
        }
        else {
          local_3c = *in_RCX;
        }
      }
      if (local_3c == 0xffffffff) {
        local_64 = 0;
        while (in_stack_fffffffffffffe14 = local_64,
              uVar2 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::size
                                ((array<irr::scene::ISkinnedMesh::SPositionKey> *)0x29fbbd),
              in_stack_fffffffffffffe14 < uVar2) {
          pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          if (in_XMM0_Da <= (float)pSVar3->frame) {
            local_3c = local_64;
            *in_RCX = local_64;
            break;
          }
          local_64 = local_64 + 1;
        }
      }
      if (local_3c != 0xffffffff) {
        if ((*(char *)(in_RDI + 0xb5) == '\0') || (local_3c == 0)) {
          pSVar3 = core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          *in_RDX = *(undefined8 *)&pSVar3->position;
          *(float *)(in_RDX + 1) = (pSVar3->position).Z;
        }
        else if (*(char *)(in_RDI + 0xb5) == '\x01') {
          core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::array<irr::scene::ISkinnedMesh::SPositionKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SPositionKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::vector3d<float>::operator-
                    ((vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          core::vector3d<float>::operator/
                    ((vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c);
          core::vector3d<float>::operator*
                    ((vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     in_stack_fffffffffffffe0c);
          vVar6 = core::vector3d<float>::operator+
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          *in_RDX = vVar6._0_8_;
          *(float *)(in_RDX + 1) = vVar6.Z;
        }
      }
    }
    uVar2 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::size
                      ((array<irr::scene::ISkinnedMesh::SScaleKey> *)0x29fe6d);
    if (uVar2 != 0) {
      local_40 = 0xffffffff;
      if (-1 < (int)*in_R9) {
        in_stack_fffffffffffffe10 = *in_R9;
        uVar2 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::size
                          ((array<irr::scene::ISkinnedMesh::SScaleKey> *)0x29fead);
        if (in_stack_fffffffffffffe10 < uVar2) {
          if ((((int)*in_R9 < 1) ||
              (pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                                  ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc), (float)pSVar4->frame < in_XMM0_Da))
             || (pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                                    ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                     in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar4->frame)
             ) {
            in_stack_fffffffffffffe0c = (float)(*in_R9 + 1);
            uVar2 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::size
                              ((array<irr::scene::ISkinnedMesh::SScaleKey> *)0x29ff4d);
            if ((((int)in_stack_fffffffffffffe0c < (int)uVar2) &&
                (pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                                    ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                     in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar4->frame)
                ) && (pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                                         ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                                          CONCAT44(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00),
                                          in_stack_fffffffffffffdfc),
                     (float)pSVar4->frame < in_XMM0_Da)) {
              *in_R9 = *in_R9 + 1;
              local_40 = *in_R9;
            }
          }
          else {
            local_40 = *in_R9;
          }
        }
      }
      if (local_40 == 0xffffffff) {
        local_fc = 0;
        while (in_stack_fffffffffffffe08 = local_fc,
              uVar2 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::size
                                ((array<irr::scene::ISkinnedMesh::SScaleKey> *)0x2a0002),
              in_stack_fffffffffffffe08 < uVar2) {
          pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          if (in_XMM0_Da <= (float)pSVar4->frame) {
            local_40 = local_fc;
            *in_R9 = local_fc;
            break;
          }
          local_fc = local_fc + 1;
        }
      }
      if (local_40 != 0xffffffff) {
        if ((*(char *)(in_RDI + 0xb5) == '\0') || (local_40 == 0)) {
          pSVar4 = core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          *in_R8 = *(undefined8 *)&pSVar4->scale;
          *(float *)(in_R8 + 1) = (pSVar4->scale).Z;
        }
        else if (*(char *)(in_RDI + 0xb5) == '\x01') {
          core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::array<irr::scene::ISkinnedMesh::SScaleKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SScaleKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::vector3d<float>::operator-
                    ((vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (vector3d<float> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          vVar6 = core::vector3d<float>::operator/
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe0c);
          in_stack_fffffffffffffe98 = vVar6.Z;
          in_stack_fffffffffffffe90 = vVar6._0_8_;
          vVar6 = core::vector3d<float>::operator*
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             in_stack_fffffffffffffe0c);
          in_stack_fffffffffffffe88 = vVar6.Z;
          in_stack_fffffffffffffe80 = vVar6._0_8_;
          vVar6 = core::vector3d<float>::operator+
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                             (vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          in_stack_fffffffffffffe78 = vVar6.Z;
          in_stack_fffffffffffffe70 = vVar6._0_8_;
          *in_R8 = in_stack_fffffffffffffe70;
          *(float *)(in_R8 + 1) = in_stack_fffffffffffffe78;
        }
      }
    }
    uVar2 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::size
                      ((array<irr::scene::ISkinnedMesh::SRotationKey> *)0x2a02ac);
    if (uVar2 != 0) {
      local_44 = 0xffffffff;
      if (-1 < (int)*in_stack_00000010) {
        in_stack_fffffffffffffe04 = *in_stack_00000010;
        uVar2 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::size
                          ((array<irr::scene::ISkinnedMesh::SRotationKey> *)0x2a02ec);
        if (in_stack_fffffffffffffe04 < uVar2) {
          if ((((int)*in_stack_00000010 < 1) ||
              (pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                                  ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdfc), (float)pSVar5->frame < in_XMM0_Da))
             || (pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                                    ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                     in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar5->frame)
             ) {
            in_stack_fffffffffffffe00 = *in_stack_00000010 + 1;
            uVar2 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::size
                              ((array<irr::scene::ISkinnedMesh::SRotationKey> *)0x2a038c);
            if (((in_stack_fffffffffffffe00 < (int)uVar2) &&
                (pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                                    ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                                     in_stack_fffffffffffffdfc), in_XMM0_Da <= (float)pSVar5->frame)
                ) && (pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                                         ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                                          CONCAT44(in_stack_fffffffffffffe04,
                                                   in_stack_fffffffffffffe00),
                                          in_stack_fffffffffffffdfc),
                     (float)pSVar5->frame < in_XMM0_Da)) {
              *in_stack_00000010 = *in_stack_00000010 + 1;
              local_44 = *in_stack_00000010;
            }
          }
          else {
            local_44 = *in_stack_00000010;
          }
        }
      }
      if (local_44 == 0xffffffff) {
        local_194 = 0;
        while (in_stack_fffffffffffffdfc = local_194,
              uVar2 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::size
                                ((array<irr::scene::ISkinnedMesh::SRotationKey> *)0x2a0437),
              in_stack_fffffffffffffdfc < uVar2) {
          pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          if (in_XMM0_Da <= (float)pSVar5->frame) {
            local_44 = local_194;
            *in_stack_00000010 = local_194;
            break;
          }
          local_194 = local_194 + 1;
        }
      }
      if (local_44 != 0xffffffff) {
        if ((*(char *)(in_RDI + 0xb5) == '\0') || (local_44 == 0)) {
          pSVar5 = core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                             ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              in_stack_fffffffffffffdfc);
          *in_stack_00000008 = *(undefined8 *)&pSVar5->rotation;
          in_stack_00000008[1] = *(undefined8 *)&(pSVar5->rotation).Z;
        }
        else if (*(char *)(in_RDI + 0xb5) == '\x01') {
          core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          core::array<irr::scene::ISkinnedMesh::SRotationKey>::operator[]
                    ((array<irr::scene::ISkinnedMesh::SRotationKey> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdfc);
          q1.Z = (f32)in_stack_fffffffffffffe98;
          q1.X = (f32)(int)in_stack_fffffffffffffe90;
          q1.Y = (f32)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
          q1.W = in_stack_fffffffffffffe9c;
          q2.Z = (f32)in_stack_fffffffffffffe88;
          q2.X = (f32)(int)in_stack_fffffffffffffe80;
          q2.Y = (f32)(int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
          q2.W = in_stack_fffffffffffffe8c;
          core::quaternion::slerp
                    ((quaternion *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),q1,
                     q2,(f32)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                     (f32)in_stack_fffffffffffffe70);
        }
      }
    }
  }
  return;
}

Assistant:

void CSkinnedMesh::getFrameData(f32 frame, SJoint *joint,
		core::vector3df &position, s32 &positionHint,
		core::vector3df &scale, s32 &scaleHint,
		core::quaternion &rotation, s32 &rotationHint)
{
	s32 foundPositionIndex = -1;
	s32 foundScaleIndex = -1;
	s32 foundRotationIndex = -1;

	if (joint->UseAnimationFrom) {
		const core::array<SPositionKey> &PositionKeys = joint->UseAnimationFrom->PositionKeys;
		const core::array<SScaleKey> &ScaleKeys = joint->UseAnimationFrom->ScaleKeys;
		const core::array<SRotationKey> &RotationKeys = joint->UseAnimationFrom->RotationKeys;

		if (PositionKeys.size()) {
			foundPositionIndex = -1;

			// Test the Hints...
			if (positionHint >= 0 && (u32)positionHint < PositionKeys.size()) {
				// check this hint
				if (positionHint > 0 && PositionKeys[positionHint].frame >= frame && PositionKeys[positionHint - 1].frame < frame)
					foundPositionIndex = positionHint;
				else if (positionHint + 1 < (s32)PositionKeys.size()) {
					// check the next index
					if (PositionKeys[positionHint + 1].frame >= frame &&
							PositionKeys[positionHint + 0].frame < frame) {
						positionHint++;
						foundPositionIndex = positionHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundPositionIndex == -1) {
				for (u32 i = 0; i < PositionKeys.size(); ++i) {
					if (PositionKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundPositionIndex = i;
						positionHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundPositionIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundPositionIndex == 0) {
					position = PositionKeys[foundPositionIndex].position;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SPositionKey &KeyA = PositionKeys[foundPositionIndex];
					const SPositionKey &KeyB = PositionKeys[foundPositionIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					position = ((KeyB.position - KeyA.position) / (fd1 + fd2)) * fd1 + KeyA.position;
				}
			}
		}

		//------------------------------------------------------------

		if (ScaleKeys.size()) {
			foundScaleIndex = -1;

			// Test the Hints...
			if (scaleHint >= 0 && (u32)scaleHint < ScaleKeys.size()) {
				// check this hint
				if (scaleHint > 0 && ScaleKeys[scaleHint].frame >= frame && ScaleKeys[scaleHint - 1].frame < frame)
					foundScaleIndex = scaleHint;
				else if (scaleHint + 1 < (s32)ScaleKeys.size()) {
					// check the next index
					if (ScaleKeys[scaleHint + 1].frame >= frame &&
							ScaleKeys[scaleHint + 0].frame < frame) {
						scaleHint++;
						foundScaleIndex = scaleHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundScaleIndex == -1) {
				for (u32 i = 0; i < ScaleKeys.size(); ++i) {
					if (ScaleKeys[i].frame >= frame) { // Keys should to be sorted by frame
						foundScaleIndex = i;
						scaleHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundScaleIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundScaleIndex == 0) {
					scale = ScaleKeys[foundScaleIndex].scale;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SScaleKey &KeyA = ScaleKeys[foundScaleIndex];
					const SScaleKey &KeyB = ScaleKeys[foundScaleIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					scale = ((KeyB.scale - KeyA.scale) / (fd1 + fd2)) * fd1 + KeyA.scale;
				}
			}
		}

		//-------------------------------------------------------------

		if (RotationKeys.size()) {
			foundRotationIndex = -1;

			// Test the Hints...
			if (rotationHint >= 0 && (u32)rotationHint < RotationKeys.size()) {
				// check this hint
				if (rotationHint > 0 && RotationKeys[rotationHint].frame >= frame && RotationKeys[rotationHint - 1].frame < frame)
					foundRotationIndex = rotationHint;
				else if (rotationHint + 1 < (s32)RotationKeys.size()) {
					// check the next index
					if (RotationKeys[rotationHint + 1].frame >= frame &&
							RotationKeys[rotationHint + 0].frame < frame) {
						rotationHint++;
						foundRotationIndex = rotationHint;
					}
				}
			}

			// The hint test failed, do a full scan...
			if (foundRotationIndex == -1) {
				for (u32 i = 0; i < RotationKeys.size(); ++i) {
					if (RotationKeys[i].frame >= frame) { // Keys should be sorted by frame
						foundRotationIndex = i;
						rotationHint = i;
						break;
					}
				}
			}

			// Do interpolation...
			if (foundRotationIndex != -1) {
				if (InterpolationMode == EIM_CONSTANT || foundRotationIndex == 0) {
					rotation = RotationKeys[foundRotationIndex].rotation;
				} else if (InterpolationMode == EIM_LINEAR) {
					const SRotationKey &KeyA = RotationKeys[foundRotationIndex];
					const SRotationKey &KeyB = RotationKeys[foundRotationIndex - 1];

					const f32 fd1 = frame - KeyA.frame;
					const f32 fd2 = KeyB.frame - frame;
					const f32 t = fd1 / (fd1 + fd2);

					/*
					f32 t = 0;
					if (KeyA.frame!=KeyB.frame)
						t = (frame-KeyA.frame) / (KeyB.frame - KeyA.frame);
					*/

					rotation.slerp(KeyA.rotation, KeyB.rotation, t);
				}
			}
		}
	}
}